

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsSupportGuaranteedVulkan_1_2(uint32_t capability)

{
  bool bVar1;
  undefined1 local_9;
  uint32_t capability_local;
  
  bVar1 = IsSupportGuaranteedVulkan_1_1(capability);
  if (bVar1) {
    local_9 = true;
  }
  else if (capability == 0x14b5) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsSupportGuaranteedVulkan_1_2(uint32_t capability) {
  if (IsSupportGuaranteedVulkan_1_1(capability)) return true;
  switch (spv::Capability(capability)) {
    case spv::Capability::ShaderNonUniform:
      return true;
    default:
      break;
  }
  return false;
}